

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_7::Validator::OnMemoryInitExpr(Validator *this,MemoryInitExpr *expr)

{
  char *pcVar1;
  int __c;
  Var *var;
  Location *loc;
  Var *__s;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)27>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckHasMemory(this,loc,(Opcode)0xc5);
  var = &expr->var;
  __s = var;
  CheckDataSegmentVar(this,var);
  pcVar1 = Var::index(var,(char *)__s,__c);
  TypeChecker::OnMemoryInit(&this->typechecker_,(uint32_t)pcVar1);
  return (Result)Ok;
}

Assistant:

Result Validator::OnMemoryInitExpr(MemoryInitExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckHasMemory(&expr->loc, Opcode::MemoryInit);
  CheckDataSegmentVar(&expr->var);
  typechecker_.OnMemoryInit(expr->var.index());
  return Result::Ok;
}